

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O2

string * __thiscall
re2c::InputAPI::expr_lessthan_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this,size_t n)

{
  ostream *poVar1;
  opt_t *poVar2;
  ostringstream s;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (this->type_ == CUSTOM) {
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<((ostream *)local_190,(string *)&poVar2->yylessthan);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,")");
  }
  else if (this->type_ == DEFAULT) {
    poVar1 = std::operator<<((ostream *)local_190,"(");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yylimit);
    poVar1 = std::operator<<(poVar1," - ");
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->yycursor);
    poVar1 = std::operator<<(poVar1,") < ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_lessthan (size_t n) const
{
	std::ostringstream s;
	switch (type_)
	{
		case DEFAULT:
			s << "(" << opts->yylimit << " - " << opts->yycursor << ") < " << n;
			break;
		case CUSTOM:
			s << opts->yylessthan << " (" << n << ")";
			break;
	}
	return s.str ();
}